

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::initStyleOption(QMenu *this,QStyleOptionMenuItem *option,QAction *action)

{
  byte *pbVar1;
  State *pSVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QMenuPrivate *this_00;
  QIconPrivate *pQVar8;
  Data *pDVar9;
  QWidgetData *pQVar10;
  uint uVar11;
  Data *pDVar12;
  bool bVar13;
  char cVar14;
  byte bVar15;
  CheckType CVar16;
  QPalette *pQVar17;
  QWidget *this_01;
  long lVar18;
  QObject *pQVar19;
  qsizetype qVar20;
  long in_FS_OFFSET;
  QKeySequence seq;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  undefined1 *local_80;
  QIconPrivate *local_78;
  QArrayData *local_70;
  char16_t *pcStack_68;
  qsizetype local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (action == (QAction *)0x0 || option == (QStyleOptionMenuItem *)0x0) goto LAB_00459d0e;
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  QStyleOption::initFrom(&option->super_QStyleOption,&this->super_QWidget);
  pQVar17 = QWidget::palette(&this->super_QWidget);
  QPalette::operator=(&(option->super_QStyleOption).palette,pQVar17);
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i = 0;
  this_01 = QWidget::window(&this->super_QWidget);
  bVar13 = QWidget::isActiveWindow(this_01);
  if (bVar13) {
    pbVar1 = (byte *)((long)&(option->super_QStyleOption).state.
                             super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                             super_QFlagsStorage<QStyle::StateFlag>.i + 2);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    cVar14 = QAction::isEnabled();
    if (cVar14 == '\0') goto LAB_00459988;
    QAction::menuObject();
    lVar18 = QMetaObject::cast((QObject *)&staticMetaObject);
    if (lVar18 != 0) {
      QAction::menuObject();
      lVar18 = QMetaObject::cast((QObject *)&staticMetaObject);
      if ((*(byte *)(*(long *)(lVar18 + 0x20) + 8) & 1) != 0) goto LAB_00459988;
    }
    pSVar2 = &(option->super_QStyleOption).state;
    *(byte *)&(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
              super_QFlagsStorage<QStyle::StateFlag>.i =
         (byte)(pSVar2->super_QFlagsStorageHelper<QStyle::StateFlag,_4>).
               super_QFlagsStorage<QStyle::StateFlag>.i | 1;
  }
  else {
LAB_00459988:
    (option->super_QStyleOption).palette.currentGroup = Disabled;
  }
  QAction::font();
  QFont::resolve((QFont *)&local_78);
  pQVar8 = *(QIconPrivate **)&option->font;
  *(QIconPrivate **)&option->font = local_78;
  uVar3 = *(undefined4 *)&option->field_0x90;
  *(undefined4 *)&option->field_0x90 = local_70._0_4_;
  local_70 = (QArrayData *)CONCAT44(local_70._4_4_,uVar3);
  local_78 = pQVar8;
  QFont::~QFont((QFont *)&local_78);
  QFont::~QFont((QFont *)&local_58);
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_78,&option->font);
  pQVar8 = *(QIconPrivate **)&(option->super_QStyleOption).fontMetrics;
  *(QIconPrivate **)&(option->super_QStyleOption).fontMetrics = local_78;
  local_78 = pQVar8;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_78);
  if (this_00->currentAction == action) {
    cVar14 = QAction::isSeparator();
    if (cVar14 == '\0') {
      (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (uint)(QMenuPrivate::mouseDown != (QMenu *)0x0) << 2 |
           (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i | 0x8000;
    }
  }
  option->menuHasCheckableItems = (bool)((byte)this_00->field_0x420 >> 1 & 1);
  cVar14 = QAction::isCheckable();
  if (cVar14 == '\0') {
    option->checkType = NotCheckable;
  }
  else {
    lVar18 = QAction::actionGroup();
    if (lVar18 == 0) {
      CVar16 = NonExclusive;
    }
    else {
      QAction::actionGroup();
      bVar15 = QActionGroup::isExclusive();
      CVar16 = NonExclusive - bVar15;
    }
    option->checkType = CVar16;
    bVar13 = (bool)QAction::isChecked();
    option->checked = bVar13;
  }
  QAction::menuObject();
  lVar18 = QMetaObject::cast((QObject *)&staticMetaObject);
  if (lVar18 == 0) {
    cVar14 = QAction::isSeparator();
    if (cVar14 == '\0') {
      pDVar9 = (this_00->defaultAction).wp.d;
      if ((pDVar9 == (Data *)0x0) || (*(int *)(pDVar9 + 4) == 0)) {
        pQVar19 = (QObject *)0x0;
      }
      else {
        pQVar19 = (this_00->defaultAction).wp.value;
      }
      if (pQVar19 == (QObject *)action) {
        option->menuItemType = DefaultItem;
      }
      else {
        option->menuItemType = Normal;
      }
    }
    else {
      option->menuItemType = Separator;
    }
  }
  else {
    option->menuItemType = SubMenu;
  }
  cVar14 = QAction::isIconVisibleInMenu();
  if (cVar14 != '\0') {
    QAction::icon();
    pDVar12 = local_58.d.d;
    local_58.d.d = (Data *)0x0;
    local_78 = (option->icon).d;
    (option->icon).d = (QIconPrivate *)pDVar12;
    QIcon::~QIcon((QIcon *)&local_78);
    QIcon::~QIcon((QIcon *)&local_58);
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAction::text();
  cVar14 = QAction::isShortcutVisibleInContextMenu();
  if (cVar14 == '\0') {
    QMenuPrivate::topCausedWidget(this_00);
    lVar18 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
    if (lVar18 != 0) goto LAB_00459bb3;
  }
  else {
LAB_00459bb3:
    local_78 = (QIconPrivate *)local_58.d.size;
    local_70 = (QArrayData *)local_58.d.ptr;
    qVar20 = QStringView::indexOf((QStringView *)&local_78,(QChar)0x9,0,CaseSensitive);
    if (qVar20 == -1) {
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QAction::shortcut();
      cVar14 = QKeySequence::isEmpty();
      if (cVar14 == '\0') {
        QKeySequence::toString((SequenceFormat)&local_98);
        local_60 = local_88;
        pcStack_68 = pcStack_90;
        local_70 = local_98;
        local_78 = (QIconPrivate *)CONCAT62(local_78._2_6_,9);
        local_98 = (QArrayData *)0x0;
        pcStack_90 = (char16_t *)0x0;
        local_88 = 0;
        operator+=(&local_58,(QStringBuilder<char16_t,_QString> *)&local_78);
        if (local_70 != (QArrayData *)0x0) {
          LOCK();
          (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_70,2,0x10);
          }
        }
        if (local_98 != (QArrayData *)0x0) {
          LOCK();
          (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_98,2,0x10);
          }
        }
      }
      QKeySequence::~QKeySequence((QKeySequence *)&local_80);
    }
  }
  QString::operator=(&option->text,(QString *)&local_58);
  uVar11 = this_00->tabWidth;
  option->maxIconWidth = this_00->maxIconWidth;
  option->reservedShortcutWidth = uVar11;
  pQVar10 = (this->super_QWidget).data;
  iVar4 = (pQVar10->crect).x2.m_i;
  iVar5 = (pQVar10->crect).y2.m_i;
  iVar6 = (pQVar10->crect).x1.m_i;
  iVar7 = (pQVar10->crect).y1.m_i;
  (option->menuRect).x1 = 0;
  (option->menuRect).y1 = 0;
  (option->menuRect).x2 = (Representation)(iVar4 - iVar6);
  (option->menuRect).y2 = (Representation)(iVar5 - iVar7);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00459d0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenu::initStyleOption(QStyleOptionMenuItem *option, const QAction *action) const
{
    if (!option || !action)
        return;

    Q_D(const QMenu);
    option->initFrom(this);
    option->palette = palette();
    option->state = QStyle::State_None;

    if (window()->isActiveWindow())
        option->state |= QStyle::State_Active;
    if (isEnabled() && action->isEnabled()
            && (!action->menu() || action->menu()->isEnabled()))
        option->state |= QStyle::State_Enabled;
    else
        option->palette.setCurrentColorGroup(QPalette::Disabled);

    option->font = action->font().resolve(font());
    option->fontMetrics = QFontMetrics(option->font);

    if (d->currentAction && d->currentAction == action && !d->currentAction->isSeparator()) {
        option->state |= QStyle::State_Selected
                     | (QMenuPrivate::mouseDown ? QStyle::State_Sunken : QStyle::State_None);
    }

    option->menuHasCheckableItems = d->hasCheckableItems;
    if (!action->isCheckable()) {
        option->checkType = QStyleOptionMenuItem::NotCheckable;
    } else {
        option->checkType = (action->actionGroup() && action->actionGroup()->isExclusive())
                            ? QStyleOptionMenuItem::Exclusive : QStyleOptionMenuItem::NonExclusive;
        option->checked = action->isChecked();
    }
    if (action->menu())
        option->menuItemType = QStyleOptionMenuItem::SubMenu;
    else if (action->isSeparator())
        option->menuItemType = QStyleOptionMenuItem::Separator;
    else if (d->defaultAction == action)
        option->menuItemType = QStyleOptionMenuItem::DefaultItem;
    else
        option->menuItemType = QStyleOptionMenuItem::Normal;
    if (action->isIconVisibleInMenu())
        option->icon = action->icon();
    QString textAndAccel = action->text();
#ifndef QT_NO_SHORTCUT
    if ((action->isShortcutVisibleInContextMenu() || !d->isContextMenu())
            && textAndAccel.indexOf(u'\t') == -1) {
        QKeySequence seq = action->shortcut();
        if (!seq.isEmpty())
            textAndAccel += u'\t' + seq.toString(QKeySequence::NativeText);
    }
#endif
    option->text = textAndAccel;
    option->reservedShortcutWidth = d->tabWidth;
    option->maxIconWidth = d->maxIconWidth;
    option->menuRect = rect();
}